

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wavesplit.cpp
# Opt level: O1

void usage(FILE *stream)

{
  fprintf((FILE *)stream,
          "USAGE: %s [-v] -V\n       %s [-v] -c <root-name> [-d <duration>] [-f <start-frame>] <filename>\n       %s [-v] -i <filename>\n\nMajor modes:\n  -c <root-name>  - Create a WAV file for each channel in the input file\n                    (default is two-channel files)\n  -d <duration>   - Number of frames to process, default all\n  -f <frame-num>  - Starting frame number, default 0\n  -h              - Show help\n  -i              - Show input file metadata (no output created)\n  -V              - Show version\n  -v              - Print extra info while processing\n\n  NOTES: o There is no option grouping, all options must be distinct arguments.\n         o All option arguments must be separated from the option by whitespace.\n\n"
          ,"wavesplit","wavesplit","wavesplit");
  return;
}

Assistant:

void
usage(FILE* stream = stderr)
{
  fprintf(stream, "\
USAGE: %s [-v] -V\n\
       %s [-v] -c <root-name> [-d <duration>] [-f <start-frame>] <filename>\n\
       %s [-v] -i <filename>\n\
\n\
Major modes:\n\
  -c <root-name>  - Create a WAV file for each channel in the input file\n\
                    (default is two-channel files)\n\
  -d <duration>   - Number of frames to process, default all\n\
  -f <frame-num>  - Starting frame number, default 0\n\
  -h              - Show help\n\
  -i              - Show input file metadata (no output created)\n\
  -V              - Show version\n\
  -v              - Print extra info while processing\n\
\n\
  NOTES: o There is no option grouping, all options must be distinct arguments.\n\
         o All option arguments must be separated from the option by whitespace.\n\
\n", PROGRAM_NAME, PROGRAM_NAME, PROGRAM_NAME);
}